

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O3

void __thiscall tchecker::clockbounds::local_lu_map_t::~local_lu_map_t(local_lu_map_t *this)

{
  pointer ppmVar1;
  
  clear(this);
  ppmVar1 = (this->_U).
            super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppmVar1 != (pointer)0x0) {
    operator_delete(ppmVar1,(long)(this->_U).
                                  super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppmVar1
                   );
  }
  ppmVar1 = (this->_L).
            super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppmVar1 != (pointer)0x0) {
    operator_delete(ppmVar1,(long)(this->_L).
                                  super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppmVar1
                   );
    return;
  }
  return;
}

Assistant:

local_lu_map_t::~local_lu_map_t() { clear(); }